

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Vec_t * Abc_DfsLevelized(Abc_Obj_t *pNode,int fTfi)

{
  int iVar1;
  Vec_Vec_t *vLevels_00;
  Abc_Obj_t *pNode_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  Vec_Vec_t *vLevels;
  int fTfi_local;
  Abc_Obj_t *pNode_local;
  
  if (fTfi != 0) {
    __assert_fail("fTfi == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x526,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
  }
  iVar1 = Abc_NtkIsNetlist(pNode->pNtk);
  if (iVar1 == 0) {
    Abc_NtkIncrementTravId(pNode->pNtk);
    vLevels_00 = Vec_VecAlloc(100);
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsCi(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x52f,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
      }
      Abc_NodeSetTravIdCurrent(pNode);
      for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pNode), local_2c < iVar1; local_2c = local_2c + 1)
      {
        pNode_00 = Abc_ObjFanout(pNode,local_2c);
        Abc_DfsLevelizedTfo_rec(pNode_00,vLevels_00);
      }
    }
    else {
      Abc_DfsLevelizedTfo_rec(pNode,vLevels_00);
    }
    return vLevels_00;
  }
  __assert_fail("!Abc_NtkIsNetlist(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                ,0x527,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
}

Assistant:

Vec_Vec_t * Abc_DfsLevelized( Abc_Obj_t * pNode, int fTfi )
{
    Vec_Vec_t * vLevels;
    Abc_Obj_t * pFanout;
    int i;
    assert( fTfi == 0 );
    assert( !Abc_NtkIsNetlist(pNode->pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vLevels = Vec_VecAlloc( 100 );
    if ( Abc_ObjIsNode(pNode) )
        Abc_DfsLevelizedTfo_rec( pNode, vLevels );
    else
    {
        assert( Abc_ObjIsCi(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Abc_DfsLevelizedTfo_rec( pFanout, vLevels );
    }
    return vLevels;
}